

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::scatterv_recv<std::array<unsigned_long,3ul>>
               (array<unsigned_long,_3UL> *out,size_t recv_size,int root,comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  comm *local_28;
  comm *comm_local;
  size_t sStack_18;
  int root_local;
  size_t recv_size_local;
  array<unsigned_long,_3UL> *out_local;
  
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = comm;
  comm_local._4_4_ = root;
  sStack_18 = recv_size;
  recv_size_local = (size_t)out;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48);
  scatterv<std::array<unsigned_long,3ul>>
            ((array<unsigned_long,_3UL> *)0x0,&local_48,(array<unsigned_long,_3UL> *)recv_size_local
             ,sStack_18,comm_local._4_4_,local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_48);
  return;
}

Assistant:

void scatterv_recv(T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    scatterv((const T*) nullptr, std::vector<size_t>(), out, recv_size, root, comm);
}